

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_changeCoeff(HModel *this,int row,int col,double newval)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n");
  std::ostream::flush();
  lVar8 = (long)col;
  piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)piVar4[lVar8];
  uVar2 = piVar4[lVar8 + 1];
  if (piVar4[lVar8] < (int)uVar2) {
    do {
      if ((this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] == row) {
        if (-1 < (long)uVar6) goto LAB_001304db;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar2 != (uint)uVar6);
  }
  iVar3 = piVar4[this->numCol];
  lVar7 = (long)iVar3;
  std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,lVar7 + 1U);
  std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,lVar7 + 1U);
  if (col < this->numCol) {
    piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar1 = piVar4 + lVar8 + 1;
      *piVar1 = *piVar1 + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->numCol);
  }
  if ((int)uVar2 < iVar3) {
    piVar4 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar4[lVar7] = piVar4[lVar7 + -1];
      pdVar5[lVar7] = pdVar5[lVar7 + -1];
      lVar7 = lVar7 + -1;
    } while ((int)uVar2 < lVar7);
  }
  uVar6 = (ulong)uVar2;
LAB_001304db:
  (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start[(int)uVar6] = newval;
  mlFg_Update(this,this->mlFg_action_NewRows);
  return;
}

Assistant:

void HModel::util_changeCoeff(int row, int col, const double newval) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n", row, col, newval);cout << flush;
#endif
  //  printf("\n\nCalled model.util_changeCoeff(row=%d, col=%d, newval=%g)\n\n", row, col, newval);cout << flush;

  //  util_reportModel();
  int cg_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
  //    printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);
    if (Aindex[el] == row) {
      cg_el = el;
      break;
    }
  }
  if (cg_el < 0) {
  //    printf("model.util_changeCoeff: Cannot find row %d in column %d\n", row, col);
    cg_el = Astart[col+1];
    int nwNnonz = Astart[numCol] + 1;
    //    printf("model.util_changeCoeff: Increasing Nnonz from %d to %d\n", Astart[numCol], nwNnonz);
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);
    for (int i=col+1; i<=numCol; i++) Astart[i]++;
    for (int el=nwNnonz-1; el>cg_el; el--) {
      Aindex[el] = Aindex[el-1];
      Avalue[el] = Avalue[el-1];
    }
  }    
  Avalue[cg_el] = newval;

  //Deduce the consequences of a changed element
  //ToDo: Can do something more intelligent if element is in nonbasic column. Otherwise, treat it as if 
  mlFg_Update(mlFg_action_NewRows);
  //  util_reportModel();

}